

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O0

JavascriptDate *
Js::JavascriptDate::NewInstanceAsConstructor
          (Arguments *args,ScriptContext *scriptContext,bool forceCurrentDate)

{
  code *pcVar1;
  ScriptContext *scriptContext_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this;
  ThreadContext *pTVar5;
  Var pvVar6;
  JavascriptDate *pJVar7;
  JavascriptString *str;
  double dVar8;
  double local_d0;
  uint local_ac;
  uint i_1;
  double curr;
  double dStack_98;
  uint i;
  double values [7];
  int parameterCount;
  Var value;
  JavascriptDate *dateObject;
  double resTime;
  JavascriptDate *pDate;
  double timeValue;
  ScriptContext *pSStack_20;
  bool forceCurrentDate_local;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  timeValue._7_1_ = forceCurrentDate;
  pSStack_20 = scriptContext;
  scriptContext_local = (ScriptContext *)args;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x6a,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDate = (JavascriptDate *)0x0;
  this = ScriptContext::GetLibrary(pSStack_20);
  resTime = (double)JavascriptLibrary::CreateDate(this);
  if (((timeValue._7_1_ & 1) == 0) && ((SUB84(args->Info,0) & 0xffffff) != 1)) {
    if ((SUB84(args->Info,0) & 0xffffff) == 2) {
      pvVar6 = Arguments::operator[](args,1);
      bVar2 = VarIs<Js::JavascriptDate>(pvVar6);
      if (bVar2) {
        pvVar6 = Arguments::operator[](args,1);
        pJVar7 = VarTo<Js::JavascriptDate>(pvVar6);
        pDate = (JavascriptDate *)(pJVar7->m_date).m_tvUtc;
      }
      else {
        pvVar6 = Arguments::operator[](args,1);
        pvVar6 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pvVar6,pSStack_20);
        bVar2 = VarIs<Js::JavascriptString>(pvVar6);
        scriptContext_00 = pSStack_20;
        if (bVar2) {
          str = VarTo<Js::JavascriptString>(pvVar6);
          pDate = (JavascriptDate *)ParseHelper(scriptContext_00,str);
        }
        else {
          pDate = (JavascriptDate *)JavascriptConversion::ToNumber(pvVar6,pSStack_20);
        }
      }
      pvVar6 = JavascriptNumber::New((double)pDate,pSStack_20);
      pDate = (JavascriptDate *)TimeClip(pvVar6);
      DateImplementation::SetTvUtc((DateImplementation *)((long)resTime + 0x20),(double)pDate);
      args_local = (Arguments *)resTime;
    }
    else {
      for (curr._4_4_ = 1; curr._4_4_ < (SUB84(args->Info,0) & 0xffffff) && curr._4_4_ < 8;
          curr._4_4_ = curr._4_4_ + 1) {
        pvVar6 = Arguments::operator[](args,curr._4_4_);
        dVar8 = JavascriptConversion::ToNumber(pvVar6,pSStack_20);
        values[(ulong)(curr._4_4_ - 1) - 1] = dVar8;
        BVar3 = JavascriptNumber::IsNan(dVar8);
        if ((BVar3 != 0) || (bVar2 = NumberUtilities::IsFinite(dVar8), !bVar2)) {
          DateImplementation::SetTvUtc((DateImplementation *)((long)resTime + 0x20),dVar8);
          return (JavascriptDate *)resTime;
        }
      }
      for (local_ac = 0; local_ac < 7; local_ac = local_ac + 1) {
        if (local_ac < (SUB84(args->Info,0) & 0xffffff) - 1) {
          dVar8 = JavascriptConversion::ToInteger(values[(ulong)local_ac - 1]);
          values[(ulong)local_ac - 1] = dVar8;
        }
        else {
          local_d0 = 1.0;
          if (local_ac != 2) {
            local_d0 = 0.0;
          }
          values[(ulong)local_ac - 1] = local_d0;
        }
      }
      if ((dStack_98 < 100.0) && (0.0 <= dStack_98)) {
        dStack_98 = dStack_98 + 1900.0;
      }
      pDate = (JavascriptDate *)
              DateUtilities::TvFromDate
                        (dStack_98,values[0],values[1] - 1.0,
                         values[4] * 1000.0 + values[2] * 3600000.0 + values[3] * 60000.0 +
                         values[5]);
      DateImplementation::SetTvLcl
                ((DateImplementation *)((long)resTime + 0x20),(double)pDate,pSStack_20);
      args_local = (Arguments *)resTime;
    }
  }
  else {
    dateObject = (JavascriptDate *)DateImplementation::NowFromHiResTimer(pSStack_20);
    bVar2 = ScriptContext::ShouldPerformReplayAction(pSStack_20);
    if (bVar2) {
      pTVar5 = ScriptContext::GetThreadContext(pSStack_20);
      TTD::EventLog::ReplayDateTimeEvent(pTVar5->TTDLog,(double *)&dateObject);
    }
    else {
      bVar2 = ScriptContext::ShouldPerformRecordAction(pSStack_20);
      if (bVar2) {
        pTVar5 = ScriptContext::GetThreadContext(pSStack_20);
        TTD::EventLog::RecordDateTimeEvent(pTVar5->TTDLog,(double)dateObject);
      }
    }
    DateImplementation::SetTvUtc((DateImplementation *)((long)resTime + 0x20),(double)dateObject);
    args_local = (Arguments *)resTime;
  }
  return (JavascriptDate *)args_local;
}

Assistant:

JavascriptDate* JavascriptDate::NewInstanceAsConstructor(Js::Arguments args, ScriptContext* scriptContext, bool forceCurrentDate)
    {
        Assert(scriptContext);

        double timeValue = 0;
        JavascriptDate* pDate;

        pDate = scriptContext->GetLibrary()->CreateDate();


        //
        // [15.9.3.3]
        // No arguments passed. Return the current time
        //
        if (forceCurrentDate || args.Info.Count == 1)
        {
            double resTime = DateImplementation::NowFromHiResTimer(scriptContext);

#if ENABLE_TTD
            if(scriptContext->ShouldPerformReplayAction())
            {
                scriptContext->GetThreadContext()->TTDLog->ReplayDateTimeEvent(&resTime);
            }
            else if(scriptContext->ShouldPerformRecordAction())
            {
                scriptContext->GetThreadContext()->TTDLog->RecordDateTimeEvent(resTime);
            }
            else
            {
                ;
            }
#endif

            pDate->m_date.SetTvUtc(resTime);
            return pDate;
        }

        //
        // [15.9.3.2]
        // One argument given
        // If string parse it and use that timeValue
        // Else convert to Number and use that as timeValue
        //
        if (args.Info.Count == 2)
        {
            if (VarIs<JavascriptDate>(args[1]))
            {
                JavascriptDate* dateObject = VarTo<JavascriptDate>(args[1]);
                timeValue = ((dateObject)->m_date).m_tvUtc;
            }
            else
            {
                Var value = JavascriptConversion::ToPrimitive<Js::JavascriptHint::None>(args[1], scriptContext);
                if (VarIs<JavascriptString>(value))
                {
                    timeValue = ParseHelper(scriptContext, VarTo<JavascriptString>(value));
                }
                else
                {
                    timeValue = JavascriptConversion::ToNumber(value, scriptContext);
                }
            }
            
            timeValue = TimeClip(JavascriptNumber::New(timeValue, scriptContext));

            pDate->m_date.SetTvUtc(timeValue);
            return pDate;
        }

        //
        // [15.9.3.1]
        // Date called with two to seven arguments
        //

        const int parameterCount = 7;
        double values[parameterCount];

        for (uint i=1; i < args.Info.Count && i < parameterCount+1; i++)
        {
            double curr = JavascriptConversion::ToNumber(args[i], scriptContext);
            values[i-1] = curr;
            if (JavascriptNumber::IsNan(curr) || !NumberUtilities::IsFinite(curr))
            {
                pDate->m_date.SetTvUtc(curr);
                return pDate;
            }
        }

        for (uint i=0; i < parameterCount; i++)
        {
            if ( i >= args.Info.Count-1 )
            {
                values[i] = ( i == 2 );
                continue;
            }
            // MakeTime (ES5 15.9.1.11) && MakeDay (ES5 15.9.1.12) always
            // call ToInteger (which is same as JavascriptConversion::ToInteger) on arguments.
            // All are finite (not Inf or Nan) as we check them explicitly in the previous loop.
            // +-0 & +0 are same in this context.
#pragma prefast(suppress:6001, "value index i < args.Info.Count - 1 are initialized")
            values[i] = JavascriptConversion::ToInteger(values[i]);
        }

        // adjust the year
        if (values[0] < 100 && values[0] >= 0)
            values[0] += 1900;

        // Get the local time value.
        timeValue = DateImplementation::TvFromDate(values[0], values[1], values[2] - 1,
            values[3] * 3600000 + values[4] * 60000 + values[5] * 1000 + values[6]);

        // Set the time.
        pDate->m_date.SetTvLcl(timeValue, scriptContext);

        return pDate;
    }